

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O2

void __thiscall
sptk::DiscreteCosineTransform::DiscreteCosineTransform(DiscreteCosineTransform *this,int dct_length)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  int iVar1;
  int i;
  long lVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  
  this->_vptr_DiscreteCosineTransform = (_func_int **)&PTR__DiscreteCosineTransform_001186c0;
  this->dct_length_ = dct_length;
  FourierTransform::FourierTransform(&this->fourier_transform_,dct_length * 2);
  this_00 = &this->cosine_table_;
  this_01 = &this->sine_table_;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])()
    ;
    __x = (double)iVar1;
    if (__x < 0.0) {
      dVar3 = sqrt(__x);
    }
    else {
      dVar3 = SQRT(__x);
    }
    std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->dct_length_);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->dct_length_);
    dVar3 = 1.0 / dVar3;
    *(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start = dVar3 / 1.4142135623730951;
    *(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    for (lVar2 = 1; lVar2 < this->dct_length_; lVar2 = lVar2 + 1) {
      dVar4 = (double)(int)lVar2 * (3.141592653589793 / __x);
      dVar5 = cos(dVar4);
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[lVar2] = dVar5 * dVar3;
      dVar4 = sin(dVar4);
      (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[lVar2] = -dVar4 * dVar3;
    }
  }
  return;
}

Assistant:

DiscreteCosineTransform::DiscreteCosineTransform(int dct_length)
    : dct_length_(dct_length), fourier_transform_(2 * dct_length_) {
  if (!fourier_transform_.IsValid()) {
    return;
  }

  const int dft_length(fourier_transform_.GetLength());
  const double argument(sptk::kPi / dft_length);
  const double c(1.0 / std::sqrt(dft_length));
  cosine_table_.resize(dct_length_);
  sine_table_.resize(dct_length_);
  cosine_table_[0] = c / std::sqrt(2.0);
  sine_table_[0] = 0.0;
  for (int i(1); i < dct_length_; ++i) {
    cosine_table_[i] = std::cos(argument * i) * c;
    sine_table_[i] = -std::sin(argument * i) * c;
  }
}